

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O0

bool __thiscall
Js::ByteCodeWriter::TryWriteReg3C<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
          (ByteCodeWriter *this,OpCode op,RegSlot R0,RegSlot R1,RegSlot R2,CacheId cacheId)

{
  bool bVar1;
  uchar local_30;
  uchar uStack_2f;
  uchar uStack_2e;
  uchar uStack_2d;
  CacheId local_2c;
  OpLayoutT_Reg3C<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> layout;
  CacheId cacheId_local;
  RegSlot R2_local;
  RegSlot R1_local;
  RegSlot R0_local;
  OpCode op_local;
  ByteCodeWriter *this_local;
  
  local_2c = cacheId;
  layout = (OpLayoutT_Reg3C<Js::LayoutSizePolicy<(Js::LayoutSize)0>_>)R2;
  bVar1 = LayoutSizePolicy<(Js::LayoutSize)0>::Assign<unsigned_char,unsigned_int>(&local_30,R0);
  if ((((bVar1) &&
       (bVar1 = LayoutSizePolicy<(Js::LayoutSize)0>::Assign<unsigned_char,unsigned_int>
                          (&uStack_2f,R1), bVar1)) &&
      (bVar1 = LayoutSizePolicy<(Js::LayoutSize)0>::Assign<unsigned_char,unsigned_int>
                         (&uStack_2e,(uint)layout), bVar1)) &&
     (bVar1 = LayoutSizePolicy<(Js::LayoutSize)0>::Assign<unsigned_char,unsigned_int>
                        (&uStack_2d,local_2c), bVar1)) {
    Data::EncodeT<(Js::LayoutSize)0>(&this->m_byteCodeData,op,&local_30,4,this);
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ByteCodeWriter::TryWriteReg3C(OpCode op, RegSlot R0, RegSlot R1, RegSlot R2, CacheId cacheId)
    {
        OpLayoutT_Reg3C<SizePolicy> layout;
        if (SizePolicy::Assign(layout.R0, R0) && SizePolicy::Assign(layout.R1, R1) && SizePolicy::Assign(layout.R2, R2)
            && SizePolicy::Assign(layout.inlineCacheIndex, cacheId))
        {
            m_byteCodeData.EncodeT<SizePolicy::LayoutEnum>(op, &layout, sizeof(layout), this);
            return true;
        }
        return false;
    }